

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeUni * __thiscall Parser::CreateUniNode(Parser *this,OpCode nop,ParseNodePtr pnode1)

{
  charcount_t ichMin;
  charcount_t ichLim;
  ParseNodeUni *pPVar1;
  
  if (pnode1 == (ParseNodePtr)0x0) {
    ichMin = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(&this->m_scan);
    ichLim = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(&this->m_scan);
  }
  else {
    ichMin = pnode1->ichMin;
    ichLim = pnode1->ichLim;
    CheckArguments(this,pnode1);
  }
  pPVar1 = CreateUniNode(this,nop,pnode1,ichMin,ichLim);
  return pPVar1;
}

Assistant:

ParseNodeUni * Parser::CreateUniNode(OpCode nop, ParseNodePtr pnode1)
{
    charcount_t ichMin;
    charcount_t ichLim;

    if (nullptr == pnode1)
    {
        // no ops
        ichMin = this->GetScanner()->IchMinTok();
        ichLim = this->GetScanner()->IchLimTok();
    }
    else
    {
        // 1 op
        ichMin = pnode1->ichMin;
        ichLim = pnode1->ichLim;
        this->CheckArguments(pnode1);
    }
    return CreateUniNode(nop, pnode1, ichMin, ichLim);
}